

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void hash_set(void *data,char *key,char *value)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  
  if (key != (char *)0x0) {
    if (value == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(value);
      sVar3 = sVar3 + 1;
    }
    puVar4 = (undefined8 *)data;
    if (data != (void *)0x0) {
      do {
        if (((char *)*puVar4 != (char *)0x0) && (iVar2 = strcmp((char *)*puVar4,key), iVar2 == 0)) {
          if ((void *)puVar4[1] != (void *)0x0) {
            free((void *)puVar4[1]);
          }
          if (value == (char *)0x0) {
            puVar4[1] = 0;
            return;
          }
          pcVar5 = (char *)malloc(sVar3);
          puVar4[1] = pcVar5;
          strcpy(pcVar5,value);
          return;
        }
        puVar1 = puVar4 + 2;
        puVar4 = (undefined8 *)*puVar1;
      } while ((undefined8 *)*puVar1 != (undefined8 *)0x0);
    }
    puVar4 = (undefined8 *)malloc(0x18);
    if (value == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = (char *)malloc(sVar3);
      strcpy(pcVar5,value);
    }
    puVar4[1] = pcVar5;
    sVar3 = strlen(key);
    pcVar5 = (char *)malloc(sVar3 + 1);
    *puVar4 = pcVar5;
    strcpy(pcVar5,key);
    puVar4[2] = *(undefined8 *)((long)data + 0x10);
    *(undefined8 **)((long)data + 0x10) = puVar4;
  }
  return;
}

Assistant:

void hash_set(void *data, char *key, char *value) {
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)...\n", key, value);
#endif
	linkedlist_t *map = (linkedlist_t *) data;

	if ( key == NULL ) {
#ifdef DEBUG
		printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
		return;
	}

	size_t length = 0;
	if ( value != NULL ) {
		length = strlen(value) + 1;
	}
	while ( map != NULL ) {
		if ( map->key != NULL && !strcmp(map->key, key) ) {
			if ( map->value != NULL ) {
				free(map->value);
			}
			if ( value != NULL ) {
				map->value = (char *) malloc(sizeof(char) * length);
				strcpy(map->value, value);
			} else {
				map->value = NULL;
			}
			return;
		}
		map = map->next;
	}

	linkedlist_t *element = (linkedlist_t *) malloc(sizeof(linkedlist_t));
	if ( value != NULL ) {
		element->value = (char *) malloc(sizeof(char) * length);
		strcpy(element->value, value);
	} else {
		element->value = NULL;
	}

	length = strlen(key) + 1;
	element->key = (char *) malloc(sizeof(char) * length);
	strcpy(element->key, key);

	map = (linkedlist_t *) data;
	element->next = map->next;
	map->next = element;
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
}